

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

int __thiscall
ON_Matrix::RowReduce
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int pt_stride,double *pt,double *pivot)

{
  ulong uVar1;
  double **ppdVar2;
  double *pdVar3;
  void *__dest;
  double ***pppdVar4;
  size_t __n;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  double *pdVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  double local_b0;
  double *local_70;
  
  __dest = onmalloc((long)pt_dim * 8);
  uVar8 = this->m_row_count;
  pppdVar4 = &(this->m_rowmem).m_a;
  if (uVar8 != (this->m_rowmem).m_count) {
    pppdVar4 = &this->m;
  }
  uVar11 = this->m_col_count;
  if ((int)uVar8 < this->m_col_count) {
    uVar11 = uVar8;
  }
  if ((int)uVar11 < 1) {
    dVar16 = 0.0;
    iVar9 = 0;
  }
  else {
    ppdVar2 = *pppdVar4;
    __n = ((long)pt_dim << 0x23) >> 0x20;
    lVar5 = (long)pt_stride;
    local_70 = pt + lVar5;
    local_b0 = 0.0;
    uVar12 = 1;
    uVar10 = 0;
    pdVar14 = pt;
    do {
      onmalloc(0);
      dVar15 = ABS(ppdVar2[uVar10][uVar10]);
      uVar1 = uVar10 + 1;
      uVar8 = (uint)uVar10;
      if ((long)uVar1 < (long)this->m_row_count) {
        uVar6 = uVar10 & 0xffffffff;
        uVar7 = uVar12;
        do {
          if (dVar15 < ABS(ppdVar2[uVar7][uVar10])) {
            uVar6 = uVar7 & 0xffffffff;
            dVar15 = ABS(ppdVar2[uVar7][uVar10]);
          }
          uVar7 = uVar7 + 1;
        } while ((uint)this->m_row_count != uVar7);
      }
      else {
        uVar6 = uVar10 & 0xffffffff;
      }
      dVar16 = dVar15;
      if ((uVar10 != 0) && (local_b0 <= dVar15)) {
        dVar16 = local_b0;
      }
      if (dVar15 <= zero_tolerance) goto LAB_004f982d;
      if (uVar10 != uVar6) {
        SwapRows(this,(int)uVar6,uVar8);
        memcpy(__dest,pt + pt_stride * (int)uVar6,__n);
        memcpy(pt + pt_stride * (int)uVar6,pt + uVar10 * lVar5,__n);
        memcpy(pt + uVar10 * lVar5,__dest,__n);
      }
      pdVar13 = ppdVar2[uVar10];
      dVar15 = 1.0 / pdVar13[uVar10];
      if ((dVar15 != 1.0) || (NAN(dVar15))) {
        pdVar13[uVar10] = 1.0;
        ON_ArrayScale(~uVar8 + this->m_col_count,dVar15,pdVar13 + uVar1,pdVar13 + uVar1);
        if (0 < pt_dim) {
          uVar6 = 0;
          do {
            pdVar14[uVar6] = pdVar14[uVar6] * dVar15;
            uVar6 = uVar6 + 1;
          } while ((uint)pt_dim != uVar6);
        }
      }
      if ((long)uVar1 < (long)this->m_row_count) {
        pdVar13 = local_70;
        uVar6 = uVar12;
        do {
          pdVar3 = ppdVar2[uVar6];
          dVar15 = pdVar3[uVar10];
          pdVar3[uVar10] = 0.0;
          if (zero_tolerance < ABS(dVar15)) {
            dVar15 = -dVar15;
            ON_Array_aA_plus_B(this->m_col_count + ~uVar8,dVar15,ppdVar2[uVar10] + uVar1,
                               pdVar3 + uVar1,pdVar3 + uVar1);
            if (0 < pt_dim) {
              uVar7 = 0;
              do {
                pdVar13[uVar7] = pdVar14[uVar7] * dVar15 + pdVar13[uVar7];
                uVar7 = uVar7 + 1;
              } while ((uint)pt_dim != uVar7);
            }
          }
          uVar6 = uVar6 + 1;
          pdVar13 = pdVar13 + lVar5;
        } while ((long)uVar6 < (long)this->m_row_count);
      }
      uVar12 = uVar12 + 1;
      pdVar14 = pdVar14 + lVar5;
      local_70 = local_70 + lVar5;
      uVar10 = uVar1;
      local_b0 = dVar16;
    } while (uVar1 != uVar11);
    uVar10 = (ulong)uVar11;
LAB_004f982d:
    iVar9 = (int)uVar10;
  }
  if (pivot != (double *)0x0) {
    *pivot = dVar16;
  }
  onfree(__dest);
  return iVar9;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    int pt_dim, int pt_stride, double* pt,
    double* pivot 
    )
{
  const int sizeof_pt = pt_dim*sizeof(pt[0]);
  double* tmp_pt = (double*)onmalloc(pt_dim*sizeof(tmp_pt[0]));
  double *ptA, *ptB;
  double x, piv;
  int i, k, ix, rank, pti;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
//    onfree( onmalloc( 1)); //  8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    // swap rows of matrix and B
    if ( ix != k ) {
      SwapRows( ix, k );
      ptA = pt + (ix*pt_stride);
      ptB = pt + (k*pt_stride);
      memcpy( tmp_pt, ptA, sizeof_pt );
      memcpy( ptA, ptB, sizeof_pt );
      memcpy( ptB, tmp_pt, sizeof_pt );
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    if ( x != 1.0 ) {
      this_m[k][k] = 1.0;
      ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
      ptA = pt + (k*pt_stride);
      for ( pti = 0; pti < pt_dim; pti++ )
        ptA[pti] *= x;
    }

    // zero column k for rows below this_m[k][k]
    ptB = pt + (k*pt_stride);
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        ptA = pt + (i*pt_stride);
        for ( pti = 0; pti < pt_dim; pti++ ) {
          ptA[pti] += x*ptB[pti];
        }
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  onfree(tmp_pt);

  return rank;
}